

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidator.cpp
# Opt level: O0

DatatypeValidator * xercesc_4_0::DatatypeValidator::loadDV(XSerializeEngine *serEng)

{
  MemoryManager *toDelete;
  MemoryManager *manager;
  DVHashTable *this;
  XSerializeEngine *local_120;
  AnySimpleTypeDatatypeValidator *anysimpletypedv;
  UnionDatatypeValidator *uniondv;
  ListDatatypeValidator *listdv;
  NOTATIONDatatypeValidator *notationdv;
  ENTITYDatatypeValidator *entitydv;
  IDREFDatatypeValidator *idrefdv;
  IDDatatypeValidator *iddv;
  DayDatatypeValidator *daydv;
  MonthDatatypeValidator *monthdv;
  YearDatatypeValidator *yeardv;
  YearMonthDatatypeValidator *yearmonthdv;
  MonthDayDatatypeValidator *monthdaydv;
  TimeDatatypeValidator *timedv;
  DateDatatypeValidator *datedv;
  DateTimeDatatypeValidator *datetimedv;
  DurationDatatypeValidator *durationdv;
  Base64BinaryDatatypeValidator *base64binarydv;
  HexBinaryDatatypeValidator *hexbinarydv;
  DecimalDatatypeValidator *decimaldv;
  DoubleDatatypeValidator *doubledv;
  FloatDatatypeValidator *floatdv;
  BooleanDatatypeValidator *booleandv;
  NCNameDatatypeValidator *ncnamedv;
  NameDatatypeValidator *namedv;
  QNameDatatypeValidator *qnamedv;
  AnyURIDatatypeValidator *anyuridv;
  StringDatatypeValidator *stringdv;
  int type;
  undefined1 local_38 [8];
  ArrayJanitor<char16_t> janName;
  XMLCh *dvName;
  XSerializeEngine *pXStack_18;
  int flag;
  XSerializeEngine *serEng_local;
  
  pXStack_18 = serEng;
  XSerializeEngine::operator>>(serEng,(int *)((long)&dvName + 4));
  if (dvName._4_4_ == -1) {
    XSerializeEngine::readString(pXStack_18,(XMLCh **)&janName.fMemoryManager);
    toDelete = janName.fMemoryManager;
    manager = XSerializeEngine::getMemoryManager(pXStack_18);
    ArrayJanitor<char16_t>::ArrayJanitor
              ((ArrayJanitor<char16_t> *)local_38,(char16_t *)toDelete,manager);
    this = DatatypeValidatorFactory::getBuiltInRegistry();
    serEng_local = (XSerializeEngine *)
                   RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::get
                             (this,janName.fMemoryManager);
    ArrayJanitor<char16_t>::~ArrayJanitor((ArrayJanitor<char16_t> *)local_38);
  }
  else if (dvName._4_4_ == -3) {
    serEng_local = (XSerializeEngine *)0x0;
  }
  else {
    XSerializeEngine::operator>>(pXStack_18,(int *)&stringdv);
    switch(stringdv._0_4_) {
    case 0:
      xercesc_4_0::operator>>(pXStack_18,(StringDatatypeValidator **)&anyuridv);
      serEng_local = (XSerializeEngine *)anyuridv;
      break;
    case 1:
      xercesc_4_0::operator>>(pXStack_18,(AnyURIDatatypeValidator **)&qnamedv);
      serEng_local = (XSerializeEngine *)qnamedv;
      break;
    case 2:
      xercesc_4_0::operator>>(pXStack_18,(QNameDatatypeValidator **)&namedv);
      serEng_local = (XSerializeEngine *)namedv;
      break;
    case 3:
      xercesc_4_0::operator>>(pXStack_18,(NameDatatypeValidator **)&ncnamedv);
      serEng_local = (XSerializeEngine *)ncnamedv;
      break;
    case 4:
      xercesc_4_0::operator>>(pXStack_18,(NCNameDatatypeValidator **)&booleandv);
      serEng_local = (XSerializeEngine *)booleandv;
      break;
    case 5:
      xercesc_4_0::operator>>(pXStack_18,(BooleanDatatypeValidator **)&floatdv);
      serEng_local = (XSerializeEngine *)floatdv;
      break;
    case 6:
      xercesc_4_0::operator>>(pXStack_18,(FloatDatatypeValidator **)&doubledv);
      serEng_local = (XSerializeEngine *)doubledv;
      break;
    case 7:
      xercesc_4_0::operator>>(pXStack_18,(DoubleDatatypeValidator **)&decimaldv);
      serEng_local = (XSerializeEngine *)decimaldv;
      break;
    case 8:
      xercesc_4_0::operator>>(pXStack_18,(DecimalDatatypeValidator **)&hexbinarydv);
      serEng_local = (XSerializeEngine *)hexbinarydv;
      break;
    case 9:
      xercesc_4_0::operator>>(pXStack_18,(HexBinaryDatatypeValidator **)&base64binarydv);
      serEng_local = (XSerializeEngine *)base64binarydv;
      break;
    case 10:
      xercesc_4_0::operator>>(pXStack_18,(Base64BinaryDatatypeValidator **)&durationdv);
      serEng_local = (XSerializeEngine *)durationdv;
      break;
    case 0xb:
      xercesc_4_0::operator>>(pXStack_18,(DurationDatatypeValidator **)&datetimedv);
      serEng_local = (XSerializeEngine *)datetimedv;
      break;
    case 0xc:
      xercesc_4_0::operator>>(pXStack_18,(DateTimeDatatypeValidator **)&datedv);
      serEng_local = (XSerializeEngine *)datedv;
      break;
    case 0xd:
      xercesc_4_0::operator>>(pXStack_18,(DateDatatypeValidator **)&timedv);
      serEng_local = (XSerializeEngine *)timedv;
      break;
    case 0xe:
      xercesc_4_0::operator>>(pXStack_18,(TimeDatatypeValidator **)&monthdaydv);
      serEng_local = (XSerializeEngine *)monthdaydv;
      break;
    case 0xf:
      xercesc_4_0::operator>>(pXStack_18,(MonthDayDatatypeValidator **)&yearmonthdv);
      serEng_local = (XSerializeEngine *)yearmonthdv;
      break;
    case 0x10:
      xercesc_4_0::operator>>(pXStack_18,(YearMonthDatatypeValidator **)&yeardv);
      serEng_local = (XSerializeEngine *)yeardv;
      break;
    case 0x11:
      xercesc_4_0::operator>>(pXStack_18,(YearDatatypeValidator **)&monthdv);
      serEng_local = (XSerializeEngine *)monthdv;
      break;
    case 0x12:
      xercesc_4_0::operator>>(pXStack_18,(MonthDatatypeValidator **)&daydv);
      serEng_local = (XSerializeEngine *)daydv;
      break;
    case 0x13:
      xercesc_4_0::operator>>(pXStack_18,(DayDatatypeValidator **)&iddv);
      serEng_local = (XSerializeEngine *)iddv;
      break;
    case 0x14:
      xercesc_4_0::operator>>(pXStack_18,(IDDatatypeValidator **)&idrefdv);
      serEng_local = (XSerializeEngine *)idrefdv;
      break;
    case 0x15:
      xercesc_4_0::operator>>(pXStack_18,(IDREFDatatypeValidator **)&entitydv);
      serEng_local = (XSerializeEngine *)entitydv;
      break;
    case 0x16:
      xercesc_4_0::operator>>(pXStack_18,(ENTITYDatatypeValidator **)&notationdv);
      serEng_local = (XSerializeEngine *)notationdv;
      break;
    case 0x17:
      xercesc_4_0::operator>>(pXStack_18,(NOTATIONDatatypeValidator **)&listdv);
      serEng_local = (XSerializeEngine *)listdv;
      break;
    case 0x18:
      xercesc_4_0::operator>>(pXStack_18,(ListDatatypeValidator **)&uniondv);
      serEng_local = (XSerializeEngine *)uniondv;
      break;
    case 0x19:
      xercesc_4_0::operator>>(pXStack_18,(UnionDatatypeValidator **)&anysimpletypedv);
      serEng_local = (XSerializeEngine *)anysimpletypedv;
      break;
    case 0x1a:
      xercesc_4_0::operator>>(pXStack_18,(AnySimpleTypeDatatypeValidator **)&local_120);
      serEng_local = local_120;
      break;
    case 0x1b:
      serEng_local = (XSerializeEngine *)0x0;
      break;
    default:
      serEng_local = (XSerializeEngine *)0x0;
    }
  }
  return (DatatypeValidator *)serEng_local;
}

Assistant:

DatatypeValidator* DatatypeValidator::loadDV(XSerializeEngine& serEng)
{

    int flag;
    serEng>>flag;

    if (DV_BUILTIN == flag)
    {
        XMLCh* dvName;
        serEng.readString(dvName);
        ArrayJanitor<XMLCh> janName(dvName, serEng.getMemoryManager());

        return DatatypeValidatorFactory::getBuiltInRegistry()->get(dvName);
    }
    else if (DV_ZERO == flag)
    {
        return 0;
    }

    int type;
    serEng>>type;

    switch((ValidatorType)type)
    {
    case String: 
        StringDatatypeValidator* stringdv;
        serEng>>stringdv;
        return stringdv;        
    case AnyURI:
        AnyURIDatatypeValidator* anyuridv;
        serEng>>anyuridv;
        return anyuridv;        
    case QName: 
        QNameDatatypeValidator* qnamedv;
        serEng>>qnamedv;
        return qnamedv;        
    case Name: 
        NameDatatypeValidator* namedv;
        serEng>>namedv;
        return namedv;        
    case NCName:  
        NCNameDatatypeValidator* ncnamedv;
        serEng>>ncnamedv;
        return ncnamedv;        
    case Boolean: 
        BooleanDatatypeValidator* booleandv;
        serEng>>booleandv;
        return booleandv;        
    case Float: 
        FloatDatatypeValidator* floatdv;
        serEng>>floatdv;
        return floatdv;        
    case Double: 
        DoubleDatatypeValidator* doubledv;
        serEng>>doubledv;
        return doubledv;        
    case Decimal: 
        DecimalDatatypeValidator* decimaldv;
        serEng>>decimaldv;
        return decimaldv;        
    case HexBinary:  
        HexBinaryDatatypeValidator* hexbinarydv;
        serEng>>hexbinarydv;
        return hexbinarydv;       
    case Base64Binary: 
        Base64BinaryDatatypeValidator* base64binarydv;
        serEng>>base64binarydv;
        return base64binarydv;      
    case Duration:     
        DurationDatatypeValidator* durationdv;
        serEng>>durationdv;
        return durationdv;
    case DateTime:       
        DateTimeDatatypeValidator* datetimedv;
        serEng>>datetimedv;
        return datetimedv; 
    case Date:          
        DateDatatypeValidator* datedv;
        serEng>>datedv;
        return datedv;
    case Time:         
        TimeDatatypeValidator* timedv;
        serEng>>timedv;
        return timedv;
    case MonthDay:      
        MonthDayDatatypeValidator* monthdaydv;
        serEng>>monthdaydv;
        return monthdaydv;
    case YearMonth:     
        YearMonthDatatypeValidator* yearmonthdv;
        serEng>>yearmonthdv;
        return yearmonthdv;
    case Year:          
        YearDatatypeValidator* yeardv;
        serEng>>yeardv;
        return yeardv;
    case Month:        
        MonthDatatypeValidator* monthdv;
        serEng>>monthdv;
        return monthdv;
    case Day:           
        DayDatatypeValidator* daydv;
        serEng>>daydv;
        return daydv;
    case ID:           
        IDDatatypeValidator* iddv;
        serEng>>iddv;
        return iddv;
    case IDREF:         
        IDREFDatatypeValidator* idrefdv;
        serEng>>idrefdv;
        return idrefdv;
    case ENTITY:       
        ENTITYDatatypeValidator* entitydv;
        serEng>>entitydv;
        return entitydv;
    case NOTATION:     
        NOTATIONDatatypeValidator* notationdv;
        serEng>>notationdv;
        return notationdv;
    case List:          
        ListDatatypeValidator* listdv;
        serEng>>listdv;
        return listdv;
    case Union:         
        UnionDatatypeValidator* uniondv;
        serEng>>uniondv;
        return uniondv;
    case AnySimpleType:  
        AnySimpleTypeDatatypeValidator* anysimpletypedv;
        serEng>>anysimpletypedv;
        return anysimpletypedv;
    case UnKnown:
        return 0;
    default: //we treat this same as UnKnown
        return 0;
    }

}